

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * __thiscall
httplib::SSLSocketStream::get_remote_addr_abi_cxx11_
          (string *__return_storage_ptr__,SSLSocketStream *this)

{
  socket_t in_EDX;
  SSLSocketStream *this_local;
  
  detail::get_remote_addr_abi_cxx11_
            (__return_storage_ptr__,(detail *)(ulong)(uint)this->sock_,in_EDX);
  return __return_storage_ptr__;
}

Assistant:

inline std::string SSLSocketStream::get_remote_addr() const {
    return detail::get_remote_addr(sock_);
}